

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

RankPreservingReshapeLayerParams * __thiscall
CoreML::Specification::RankPreservingReshapeLayerParams::New
          (RankPreservingReshapeLayerParams *this,Arena *arena)

{
  RankPreservingReshapeLayerParams *this_00;
  
  this_00 = (RankPreservingReshapeLayerParams *)operator_new(0x28);
  RankPreservingReshapeLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::RankPreservingReshapeLayerParams>
              (arena,this_00);
  }
  return this_00;
}

Assistant:

RankPreservingReshapeLayerParams* RankPreservingReshapeLayerParams::New(::google::protobuf::Arena* arena) const {
  RankPreservingReshapeLayerParams* n = new RankPreservingReshapeLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}